

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

Generator * kratos::MergeWireAssignmentsVisitor::get_parent(StmtBlock *block)

{
  initializer_list<kratos::IRNode_*> __l;
  int iVar1;
  IRNodeKind IVar2;
  undefined4 extraout_var;
  StmtException *this;
  IRNode *local_b0;
  allocator<kratos::IRNode_*> local_99;
  Generator *local_98;
  Generator **local_90;
  size_type local_88;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_80;
  allocator<char> local_51;
  string local_50;
  StmtBlock *local_30;
  IRNode *p;
  StmtBlock *pSStack_20;
  uint32_t i;
  IRNode *node;
  Generator *result;
  StmtBlock *block_local;
  
  node = (IRNode *)0x0;
  p._4_4_ = 0;
  pSStack_20 = block;
  result = (Generator *)block;
  do {
    if (9999 < p._4_4_) {
LAB_00abf7b5:
      if (node == (IRNode *)0x0) {
        this = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Cannot find parent for the statement block",&local_51);
        local_98 = result;
        local_90 = &local_98;
        local_88 = 1;
        std::allocator<kratos::IRNode_*>::allocator(&local_99);
        __l._M_len = local_88;
        __l._M_array = (iterator)local_90;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_80,__l,&local_99);
        StmtException::StmtException(this,&local_50,&local_80);
        __cxa_throw(this,&StmtException::typeinfo,StmtException::~StmtException);
      }
      return (Generator *)node;
    }
    iVar1 = (*(pSStack_20->super_Stmt).super_IRNode._vptr_IRNode[4])();
    local_30 = (StmtBlock *)CONCAT44(extraout_var,iVar1);
    IVar2 = IRNode::ir_node_kind((IRNode *)local_30);
    if (IVar2 == GeneratorKind) {
      if (local_30 == (StmtBlock *)0x0) {
        local_b0 = (IRNode *)0x0;
      }
      else {
        local_b0 = (IRNode *)__dynamic_cast(local_30,&IRNode::typeinfo,&Generator::typeinfo,0);
      }
      node = local_b0;
      goto LAB_00abf7b5;
    }
    pSStack_20 = local_30;
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

static Generator* get_parent(StmtBlock* block) {
        Generator* result = nullptr;
        IRNode* node = block;
        for (uint32_t i = 0; i < 10000u; i++) {
            auto* p = node->parent();
            if (p->ir_node_kind() == IRNodeKind::GeneratorKind) {
                result = dynamic_cast<Generator*>(p);
                break;
            }
            node = p;
        }
        if (!result) {
            throw StmtException("Cannot find parent for the statement block", {block});
        }
        return result;
    }